

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O2

Hop_Obj_t *
Abc_NodeIfToHop2_rec(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *pHVar2;
  If_Obj_t *pIVar3;
  
  if (*(Hop_Obj_t **)&pIfObj->CutBest != (Hop_Obj_t *)0x0) {
    return *(Hop_Obj_t **)&pIfObj->CutBest;
  }
  Vec_PtrPush(vVisited,&pIfObj->CutBest);
  (pIfObj->CutBest).Area = 1.4013e-45;
  (pIfObj->CutBest).Edge = 0.0;
  pIVar3 = pIfObj;
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) == (undefined1  [112])0x2) {
    pHVar1 = (Hop_Obj_t *)0x1;
  }
  else {
    for (; pIVar3 != (If_Obj_t *)0x0; pIVar3 = pIVar3->pEquiv) {
      pHVar1 = Abc_NodeIfToHop2_rec(pHopMan,pIfMan,pIVar3->pFanin0,vVisited);
      if ((pHVar1 != (Hop_Obj_t *)0x1) &&
         (pHVar2 = Abc_NodeIfToHop2_rec(pHopMan,pIfMan,pIVar3->pFanin1,vVisited),
         pHVar2 != (Hop_Obj_t *)0x1)) {
        pHVar2 = Hop_And(pHopMan,(Hop_Obj_t *)((ulong)(*(uint *)pIVar3 >> 4 & 1) ^ (ulong)pHVar1),
                         (Hop_Obj_t *)((ulong)(*(uint *)pIVar3 >> 5 & 1) ^ (ulong)pHVar2));
        pHVar1 = (Hop_Obj_t *)((ulong)pHVar2 ^ 1);
        if (((*(uint *)pIfObj ^ *(uint *)pIVar3) & 0x40) == 0) {
          pHVar1 = pHVar2;
        }
        *(Hop_Obj_t **)&pIfObj->CutBest = pHVar1;
        return pHVar1;
      }
    }
    pHVar1 = *(Hop_Obj_t **)&pIfObj->CutBest;
  }
  return pHVar1;
}

Assistant:

static inline void *     If_CutData( If_Cut_t * pCut )                       { return *(void **)pCut;                }